

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QSslCipher>::clear(QList<QSslCipher> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QGenericArrayOps<QSslCipher> *this_00;
  __off_t __length;
  QArrayDataPointer<QSslCipher> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QSslCipher> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  qsizetype alloc;
  QArrayDataPointer<QSslCipher> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<QSslCipher> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<QSslCipher>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<QSslCipher>::needsDetach(in_RDI);
    if (bVar2) {
      qVar3 = -0x5555555555555556;
      alloc = -0x5555555555555556;
      pQVar4 = (QArrayDataPointer<QSslCipher> *)0xaaaaaaaaaaaaaaaa;
      QArrayDataPointer<QSslCipher>::allocatedCapacity(in_RDI);
      QArrayDataPointer<QSslCipher>::QArrayDataPointer(pQVar4,alloc,qVar3,option);
      QArrayDataPointer<QSslCipher>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<QSslCipher>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QGenericArrayOps<QSslCipher> *)QArrayDataPointer<QSslCipher>::operator->(in_RDI);
      QtPrivate::QGenericArrayOps<QSslCipher>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }